

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util.cc
# Opt level: O3

Status * __thiscall
google::protobuf::util::anon_unknown_1::DescriptorPoolTypeResolver::ResolveMessageType
          (Status *__return_storage_ptr__,DescriptorPoolTypeResolver *this,string *type_url,
          Type *type)

{
  int iVar1;
  once_flag *poVar2;
  pointer pcVar3;
  long lVar4;
  StringPiece error_message;
  bool bVar5;
  uint uVar6;
  Rep *pRVar7;
  Field *pFVar8;
  LogMessage *other;
  EnumValueDescriptor *pEVar9;
  Descriptor *pDVar10;
  long *plVar11;
  EnumDescriptor *pEVar12;
  undefined8 *puVar13;
  SourceContext *pSVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  RepeatedPtrField<google::protobuf::Option> *output;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX;
  RepeatedPtrField<google::protobuf::Option> *extraout_RDX_00;
  RepeatedPtrField<google::protobuf::Option> *output_00;
  int iVar17;
  Arena *initial_value;
  Arena *pAVar18;
  char *pcVar19;
  string *psVar20;
  long lVar21;
  long lVar22;
  undefined1 local_110 [8];
  Status status;
  string type_name;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  Descriptor *local_98;
  LogMessage local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  status.error_message_.field_2._8_8_ = &type_name._M_string_length;
  type_name._M_dataplus._M_p = (pointer)0x0;
  type_name._M_string_length._0_1_ = 0;
  ParseTypeUrl((Status *)local_110,this,type_url,
               (string *)((long)&status.error_message_.field_2 + 8));
  if (local_110._0_4_ == OK) {
    local_98 = DescriptorPool::FindMessageTypeByName
                         (this->pool_,(string *)((long)&status.error_message_.field_2 + 8));
    if (local_98 == (Descriptor *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     "Invalid type URL, unknown type: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&status.error_message_.field_2 + 8));
      error_message.length_ = (stringpiece_ssize_type)local_90.filename_;
      error_message.ptr_ = (char *)local_90._0_8_;
      if ((long)local_90.filename_ < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)local_90.filename_,"size_t to int conversion");
      }
      Status::Status(__return_storage_ptr__,NOT_FOUND,error_message);
      if ((__pointer_type)local_90._0_8_ != ((__pointer_type)((long)&local_90 + 0x10U))._M_p) {
        operator_delete((void *)local_90._0_8_);
      }
    }
    else {
      Type::Clear(type);
      pAVar18 = (Arena *)(type->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar18 & 1) != 0) {
        pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
      }
      psVar20 = (type->name_).ptr_;
      if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        protobuf::internal::ArenaStringPtr::CreateInstance
                  (&type->name_,pAVar18,*(string **)(local_98 + 8));
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar20);
      }
      type_name.field_2._8_8_ = __return_storage_ptr__;
      if (0 < *(int *)(local_98 + 0x68)) {
        lVar22 = 0;
        local_c0 = 0;
        do {
          lVar21 = *(long *)(local_98 + 0x28);
          pRVar7 = (type->fields_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar7 == (Rep *)0x0) {
            iVar17 = (type->fields_).super_RepeatedPtrFieldBase.total_size_;
LAB_0032db11:
            protobuf::internal::RepeatedPtrFieldBase::Reserve
                      (&(type->fields_).super_RepeatedPtrFieldBase,iVar17 + 1);
            pRVar7 = (type->fields_).super_RepeatedPtrFieldBase.rep_;
            iVar17 = pRVar7->allocated_size;
LAB_0032db2c:
            pRVar7->allocated_size = iVar17 + 1;
            pFVar8 = Arena::CreateMaybeMessage<google::protobuf::Field>
                               ((type->fields_).super_RepeatedPtrFieldBase.arena_);
            pRVar7 = (type->fields_).super_RepeatedPtrFieldBase.rep_;
            iVar17 = (type->fields_).super_RepeatedPtrFieldBase.current_size_;
            (type->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar17 + 1;
            pRVar7->elements[iVar17] = pFVar8;
          }
          else {
            iVar1 = (type->fields_).super_RepeatedPtrFieldBase.current_size_;
            iVar17 = pRVar7->allocated_size;
            if (iVar17 <= iVar1) {
              if (iVar17 == (type->fields_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_0032db11;
              goto LAB_0032db2c;
            }
            (type->fields_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            pFVar8 = (Field *)pRVar7->elements[iVar1];
          }
          local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(lVar21 + lVar22);
          poVar2 = *(once_flag **)(lVar21 + 0x30 + lVar22);
          if (poVar2 != (once_flag *)0x0) {
            local_90._0_8_ = FieldDescriptor::TypeOnceInit;
            local_50._M_dataplus._M_p = (pointer)local_58;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar2,(_func_void_FieldDescriptor_ptr **)&local_90,
                       (FieldDescriptor **)&local_50);
          }
          pFVar8->kind_ = *(int *)(lVar21 + 0x38 + lVar22);
          iVar17 = *(int *)(lVar21 + 0x3c + lVar22);
          if (iVar17 - 1U < 3) {
            pFVar8->cardinality_ = iVar17;
          }
          pFVar8->number_ = *(int32 *)(lVar21 + 0x44 + lVar22);
          pAVar18 = (Arena *)(pFVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar18 & 1) != 0) {
            pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
          }
          psVar20 = (pFVar8->name_).ptr_;
          if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            protobuf::internal::ArenaStringPtr::CreateInstance
                      (&pFVar8->name_,pAVar18,*(string **)(lVar21 + lVar22));
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar20);
          }
          pAVar18 = (Arena *)(pFVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar18 & 1) != 0) {
            pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
          }
          initial_value = *(Arena **)(lVar21 + 0x20 + lVar22);
          psVar20 = (pFVar8->json_name_).ptr_;
          if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
            protobuf::internal::ArenaStringPtr::CreateInstance
                      (&pFVar8->json_name_,pAVar18,(string *)initial_value);
          }
          else {
            std::__cxx11::string::_M_assign((string *)psVar20);
            pAVar18 = initial_value;
          }
          if (*(char *)(lVar21 + 0x40 + lVar22) == '\x01') {
            poVar2 = *(once_flag **)(lVar21 + 0x30 + lVar22);
            if (poVar2 != (once_flag *)0x0) {
              local_90._0_8_ = FieldDescriptor::TypeOnceInit;
              local_a0 = local_58;
              pAVar18 = (Arena *)&local_90;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar2,(_func_void_FieldDescriptor_ptr **)pAVar18,
                         (FieldDescriptor **)&local_a0);
            }
            uVar6 = *(uint *)(lVar21 + 0x38 + lVar22);
            switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)uVar6 * 4)) {
            case 1:
              local_90._0_8_ = (long)&local_90 + 0x10;
              pcVar19 = FastInt32ToBufferLeft
                                  (*(int32 *)(lVar21 + 0x90 + lVar22),(char *)local_90._0_8_);
              local_90.filename_ = pcVar19 + -((long)&local_90 + 0x10U);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_90._0_8_,
                         (code *)((long)&((__pointer_type)local_90.filename_)->arena_ +
                                 local_90._0_8_));
              break;
            case 2:
              local_90._0_8_ = (long)&local_90 + 0x10;
              pcVar19 = FastInt64ToBufferLeft
                                  (*(int64 *)(lVar21 + 0x90 + lVar22),(char *)local_90._0_8_);
              local_90.filename_ = pcVar19 + -((long)&local_90 + 0x10U);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_90._0_8_,
                         (code *)((long)&((__pointer_type)local_90.filename_)->arena_ +
                                 local_90._0_8_));
              break;
            case 3:
              local_90._0_8_ = (long)&local_90 + 0x10;
              pcVar19 = FastUInt32ToBufferLeft
                                  (*(uint32 *)(lVar21 + 0x90 + lVar22),(char *)local_90._0_8_);
              local_90.filename_ = pcVar19 + -((long)&local_90 + 0x10U);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_90._0_8_,
                         (code *)((long)&((__pointer_type)local_90.filename_)->arena_ +
                                 local_90._0_8_));
              break;
            case 4:
              local_90._0_8_ = (long)&local_90 + 0x10;
              pcVar19 = FastUInt64ToBufferLeft
                                  (*(uint64 *)(lVar21 + 0x90 + lVar22),(char *)local_90._0_8_);
              local_90.filename_ = pcVar19 + -((long)&local_90 + 0x10U);
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,local_90._0_8_,
                         (code *)((long)&((__pointer_type)local_90.filename_)->arena_ +
                                 local_90._0_8_));
              break;
            case 5:
              SimpleDtoa_abi_cxx11_
                        (&local_50,(protobuf *)pAVar18,*(double *)(lVar21 + 0x90 + lVar22));
              break;
            case 6:
              SimpleFtoa_abi_cxx11_
                        (&local_50,(protobuf *)pAVar18,*(float *)(lVar21 + 0x90 + lVar22));
              break;
            case 7:
              uVar16 = (ulong)*(byte *)(lVar21 + 0x90 + lVar22);
              pcVar19 = "false";
              if (uVar16 != 0) {
                pcVar19 = "true";
              }
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_50,pcVar19,pcVar19 + (uVar16 ^ 5));
              break;
            case 8:
              pEVar9 = FieldDescriptor::default_value_enum
                                 ((FieldDescriptor *)local_58->_M_local_buf);
              psVar20 = *(string **)pEVar9;
LAB_0032ded4:
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              pcVar3 = (psVar20->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_50,pcVar3,pcVar3 + psVar20->_M_string_length);
              break;
            case 9:
              poVar2 = *(once_flag **)(lVar21 + 0x30 + lVar22);
              if (poVar2 != (once_flag *)0x0) {
                local_90._0_8_ = FieldDescriptor::TypeOnceInit;
                local_a0 = local_58;
                std::
                call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                          (poVar2,(_func_void_FieldDescriptor_ptr **)&local_90,
                           (FieldDescriptor **)&local_a0);
                uVar6 = *(uint *)(lVar21 + 0x38 + lVar22);
              }
              psVar20 = *(string **)(lVar21 + 0x90 + lVar22);
              if (uVar6 != 0xc) goto LAB_0032ded4;
              CEscape(&local_50,psVar20);
              break;
            case 10:
              protobuf::internal::LogMessage::LogMessage
                        (&local_90,LOGLEVEL_DFATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/type_resolver_util.cc"
                         ,0x161);
              other = protobuf::internal::LogMessage::operator<<
                                (&local_90,"Messages can\'t have default values!");
              protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a0,other);
              protobuf::internal::LogMessage::~LogMessage(&local_90);
            default:
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              local_50._M_string_length = 0;
              local_50.field_2._M_allocated_capacity =
                   local_50.field_2._M_allocated_capacity & 0xffffffffffffff00;
            }
            pAVar18 = (Arena *)(pFVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar18 & 1) != 0) {
              pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
            }
            psVar20 = (pFVar8->default_value_).ptr_;
            if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              protobuf::internal::ArenaStringPtr::CreateInstance
                        (&pFVar8->default_value_,pAVar18,&local_50);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar20);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          poVar2 = *(once_flag **)(lVar21 + 0x30 + lVar22);
          if (poVar2 != (once_flag *)0x0) {
            local_90._0_8_ = FieldDescriptor::TypeOnceInit;
            local_50._M_dataplus._M_p = (pointer)local_58;
            std::
            call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar2,(_func_void_FieldDescriptor_ptr **)&local_90,
                       (FieldDescriptor **)&local_50);
          }
          iVar17 = *(int *)(lVar21 + 0x38 + lVar22);
          if (iVar17 == 0xb) {
LAB_0032dfb1:
            pDVar10 = FieldDescriptor::message_type((FieldDescriptor *)local_58->_M_local_buf);
            pcVar3 = (this->url_prefix_)._M_dataplus._M_p;
            local_90._0_8_ = (long)&local_90 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + (this->url_prefix_)._M_string_length);
            std::__cxx11::string::append((char *)&local_90);
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_90,**(ulong **)(pDVar10 + 8));
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 == paVar15) {
              local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_50.field_2._8_8_ = plVar11[3];
            }
            else {
              local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
              local_50._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_50._M_string_length = plVar11[1];
            *plVar11 = (long)paVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            if ((__pointer_type)local_90._0_8_ != ((__pointer_type)((long)&local_90 + 0x10U))._M_p)
            {
              operator_delete((void *)local_90._0_8_);
            }
            pAVar18 = (Arena *)(pFVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
            if (((ulong)pAVar18 & 1) != 0) {
              pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
            }
            psVar20 = (pFVar8->type_url_).ptr_;
            if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              protobuf::internal::ArenaStringPtr::CreateInstance
                        (&pFVar8->type_url_,pAVar18,&local_50);
            }
            else {
              std::__cxx11::string::_M_assign((string *)psVar20);
            }
LAB_0032e1c9:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
          }
          else {
            poVar2 = *(once_flag **)(lVar21 + 0x30 + lVar22);
            if (poVar2 != (once_flag *)0x0) {
              local_90._0_8_ = FieldDescriptor::TypeOnceInit;
              local_50._M_dataplus._M_p = (pointer)local_58;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar2,(_func_void_FieldDescriptor_ptr **)&local_90,
                         (FieldDescriptor **)&local_50);
              iVar17 = *(int *)(lVar21 + 0x38 + lVar22);
            }
            if (iVar17 == 10) goto LAB_0032dfb1;
            poVar2 = *(once_flag **)(lVar21 + 0x30 + lVar22);
            if (poVar2 != (once_flag *)0x0) {
              local_90._0_8_ = FieldDescriptor::TypeOnceInit;
              local_50._M_dataplus._M_p = (pointer)local_58;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (poVar2,(_func_void_FieldDescriptor_ptr **)&local_90,
                         (FieldDescriptor **)&local_50);
              iVar17 = *(int *)(lVar21 + 0x38 + lVar22);
            }
            if (iVar17 == 0xe) {
              pEVar12 = FieldDescriptor::enum_type((FieldDescriptor *)local_58->_M_local_buf);
              pcVar3 = (this->url_prefix_)._M_dataplus._M_p;
              local_90._0_8_ = (long)&local_90 + 0x10;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,pcVar3,pcVar3 + (this->url_prefix_)._M_string_length);
              std::__cxx11::string::append((char *)&local_90);
              puVar13 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_90,**(ulong **)(pEVar12 + 8))
              ;
              local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
              paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar13 == paVar15) {
                local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_50.field_2._8_8_ = puVar13[3];
              }
              else {
                local_50.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
                local_50._M_dataplus._M_p = (pointer)*puVar13;
              }
              local_50._M_string_length = puVar13[1];
              *puVar13 = paVar15;
              puVar13[1] = 0;
              *(undefined1 *)(puVar13 + 2) = 0;
              if ((__pointer_type)local_90._0_8_ != ((__pointer_type)((long)&local_90 + 0x10U))._M_p
                 ) {
                operator_delete((void *)local_90._0_8_);
              }
              pAVar18 = (Arena *)(pFVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
              if (((ulong)pAVar18 & 1) != 0) {
                pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
              }
              psVar20 = (pFVar8->type_url_).ptr_;
              if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                protobuf::internal::ArenaStringPtr::CreateInstance
                          (&pFVar8->type_url_,pAVar18,&local_50);
              }
              else {
                std::__cxx11::string::_M_assign((string *)psVar20);
              }
              goto LAB_0032e1c9;
            }
          }
          lVar4 = *(long *)(lVar21 + 0x58 + lVar22);
          if (lVar4 != 0) {
            pFVar8->oneof_index_ =
                 (int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x30)) >> 4) *
                 -0x55555555 + 1;
          }
          bVar5 = FieldDescriptor::is_packed((FieldDescriptor *)local_58->_M_local_buf);
          if (bVar5) {
            pFVar8->packed_ = true;
          }
          ConvertOptionsInternal
                    (*(DescriptorPoolTypeResolver **)(lVar21 + 0x78 + lVar22),
                     (Message *)&pFVar8->options_,output);
          local_c0 = local_c0 + 1;
          lVar22 = lVar22 + 0x98;
        } while (local_c0 < *(int *)(local_98 + 0x68));
      }
      pDVar10 = local_98;
      if (0 < *(int *)(local_98 + 0x6c)) {
        lVar22 = 0;
        lVar21 = 0;
        do {
          Type::add_oneofs(type,*(string **)(*(long *)(pDVar10 + 0x30) + lVar22));
          lVar21 = lVar21 + 1;
          lVar22 = lVar22 + 0x30;
        } while (lVar21 < *(int *)(pDVar10 + 0x6c));
      }
      __return_storage_ptr__ = (Status *)type_name.field_2._8_8_;
      pSVar14 = type->source_context_;
      if (pSVar14 == (SourceContext *)0x0) {
        pAVar18 = (Arena *)(type->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar18 & 1) != 0) {
          pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
        }
        pSVar14 = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar18);
        type->source_context_ = pSVar14;
      }
      pAVar18 = (Arena *)(pSVar14->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar18 & 1) != 0) {
        pAVar18 = *(Arena **)((ulong)pAVar18 & 0xfffffffffffffffe);
      }
      psVar20 = (pSVar14->file_name_).ptr_;
      if (psVar20 == (string *)&protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        protobuf::internal::ArenaStringPtr::CreateInstance
                  (&pSVar14->file_name_,pAVar18,(string *)**(undefined8 **)(local_98 + 0x10));
        output_00 = extraout_RDX_00;
      }
      else {
        std::__cxx11::string::_M_assign((string *)psVar20);
        output_00 = extraout_RDX;
      }
      ConvertOptionsInternal
                (*(DescriptorPoolTypeResolver **)(local_98 + 0x20),(Message *)&type->options_,
                 output_00);
      Status::Status(__return_storage_ptr__);
    }
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_110);
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  if ((size_type *)status.error_message_.field_2._8_8_ != &type_name._M_string_length) {
    operator_delete((void *)status.error_message_.field_2._8_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ResolveMessageType(const std::string& type_url, Type* type) override {
    std::string type_name;
    Status status = ParseTypeUrl(type_url, &type_name);
    if (!status.ok()) {
      return status;
    }

    const Descriptor* descriptor = pool_->FindMessageTypeByName(type_name);
    if (descriptor == NULL) {
      return Status(util::error::NOT_FOUND,
                    "Invalid type URL, unknown type: " + type_name);
    }
    ConvertDescriptor(descriptor, type);
    return Status();
  }